

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O1

int __thiscall ACSStringPool::InsertString(ACSStringPool *this,FString *str,uint h,uint bucketnum)

{
  PoolEntry *this_00;
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  uint *puVar4;
  uint uVar5;
  uint uVar6;
  
  uVar5 = this->FirstFreeEntry;
  if ((99 < uVar5) && (uVar5 == (this->Pool).Most)) {
    P_CollectACSGlobalStrings();
    uVar5 = this->FirstFreeEntry;
  }
  uVar1 = (ulong)this->FirstFreeEntry;
  uVar6 = 0xffffffff;
  if (uVar1 < 0x7ff00000) {
    uVar6 = (this->Pool).Count;
    if (uVar5 == uVar6) {
      TArray<ACSStringPool::PoolEntry,_ACSStringPool::PoolEntry>::Reserve(&this->Pool,1);
      uVar3 = this->FirstFreeEntry + 1;
    }
    else {
      uVar3 = this->FirstFreeEntry + 1;
      if (uVar3 < uVar6) {
        uVar2 = uVar1 + 1;
        puVar4 = &(this->Pool).Array[uVar1 + 1].Next;
        do {
          if (*puVar4 == 0xfffffffe) {
            uVar3 = (uint)uVar2;
            break;
          }
          uVar2 = uVar2 + 1;
          puVar4 = puVar4 + 6;
          uVar3 = uVar6;
        } while (uVar6 != uVar2);
      }
    }
    this->FirstFreeEntry = uVar3;
    this_00 = (this->Pool).Array + uVar5;
    FString::operator=(&this_00->Str,str);
    this_00->Hash = h;
    this_00->Next = this->PoolBuckets[bucketnum];
    this_00->LockCount = 0;
    this->PoolBuckets[bucketnum] = uVar5;
    uVar6 = uVar5 | 0x7ff00000;
  }
  return uVar6;
}

Assistant:

int ACSStringPool::InsertString(FString &str, unsigned int h, unsigned int bucketnum)
{
	unsigned int index = FirstFreeEntry;
	if (index >= MIN_GC_SIZE && index == Pool.Max())
	{ // We will need to grow the array. Try a garbage collection first.
		P_CollectACSGlobalStrings();
		index = FirstFreeEntry;
	}
	if (FirstFreeEntry >= STRPOOL_LIBRARYID_OR)
	{ // If we go any higher, we'll collide with the library ID marker.
		return -1;
	}
	if (index == Pool.Size())
	{ // There were no free entries; make a new one.
		Pool.Reserve(1);
		FirstFreeEntry++;
	}
	else
	{ // Scan for the next free entry
		FindFirstFreeEntry(FirstFreeEntry + 1);
	}
	PoolEntry *entry = &Pool[index];
	entry->Str = str;
	entry->Hash = h;
	entry->Next = PoolBuckets[bucketnum];
	entry->LockCount = 0;
	PoolBuckets[bucketnum] = index;
	return index | STRPOOL_LIBRARYID_OR;
}